

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>::
     Finalize<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *state,
               hugeint_t *target,AggregateFinalizeData *finalize_data)

{
  FunctionData *pFVar1;
  reference q;
  idx_t n;
  hugeint_t hVar2;
  Interpolator<true> interp;
  QuantileDirect<duckdb::hugeint_t> local_51;
  Interpolator<true> local_50;
  
  if ((state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
      super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
      super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    q = vector<duckdb::QuantileValue,_true>::get<true>
                  ((vector<duckdb::QuantileValue,_true> *)(pFVar1 + 1),0);
    n = (long)(state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
              super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
              super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
              super__Vector_impl_data._M_start >> 4;
    local_50.desc = *(bool *)&pFVar1[7]._vptr_FunctionData;
    local_50.FRN = Interpolator<true>::Index(q,n);
    local_50.begin = 0;
    local_50.CRN = local_50.FRN;
    local_50.end = n;
    hVar2 = Interpolator<true>::
            Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::QuantileDirect<duckdb::hugeint_t>>
                      (&local_50,
                       (state->v).
                       super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
                       super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
                       _M_impl.super__Vector_impl_data._M_start,finalize_data->result,&local_51);
    *target = hVar2;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		Interpolator<DISCRETE> interp(bind_data.quantiles[0], state.v.size(), bind_data.desc);
		target = interp.template Operation<typename STATE::InputType, T>(state.v.data(), finalize_data.result);
	}